

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O2

shared_ptr<notch::core::ActivationLayer> __thiscall
notch::core::ActivationLayer::makeClone(ActivationLayer *this)

{
  runtime_error *this_00;
  int in_ECX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  void *in_R8;
  shared_ptr<notch::core::ActivationLayer> sVar1;
  SharedBuffers SStack_38;
  
  sVar1 = ::std::make_shared<notch::core::ActivationLayer,notch::core::ActivationLayer_const&>(this)
  ;
  if ((this->super_ABackpropLayer)._vptr_ABackpropLayer != (_func_int **)0x0) {
    SharedBuffers::clone
              (&SStack_38,(__fn *)(in_RSI + 8),
               sVar1.super___shared_ptr<notch::core::ActivationLayer,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._M_pi,in_ECX,in_R8);
    SharedBuffers::operator=
              ((SharedBuffers *)((this->super_ABackpropLayer)._vptr_ABackpropLayer + 1),&SStack_38);
    SharedBuffers::~SharedBuffers(&SStack_38);
    sVar1.super___shared_ptr<notch::core::ActivationLayer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = extraout_RDX._M_pi;
    sVar1.super___shared_ptr<notch::core::ActivationLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this
    ;
    return (shared_ptr<notch::core::ActivationLayer>)
           sVar1.super___shared_ptr<notch::core::ActivationLayer,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::runtime_error::runtime_error(this_00,"cannot clone ActivationLayer");
  __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

std::shared_ptr<ActivationLayer> makeClone() const {
        auto p = std::make_shared<ActivationLayer>(*this);
        if (!p) {
            throw std::runtime_error("cannot clone ActivationLayer");
        }
        p->shared = shared.clone();
        return p;
    }